

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::PushText(XMLPrinter *this,char *text,bool cdata)

{
  size_t sVar1;
  
  this->_textDepth = this->_depth + -1;
  if (this->_elementJustOpened == true) {
    this->_elementJustOpened = false;
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xf])(this,0x3e);
  }
  if (cdata) {
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xe])(this,"<![CDATA[",9);
    sVar1 = strlen(text);
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xe])(this,text,sVar1);
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xe])(this,"]]>",3);
    return;
  }
  PrintString(this,text,true);
  return;
}

Assistant:

void XMLPrinter::PushText( const char* text, bool cdata )
{
    _textDepth = _depth-1;

    SealElementIfJustOpened();
    if ( cdata ) {
        Write( "<![CDATA[" );
        Write( text );
        Write( "]]>" );
    }
    else {
        PrintString( text, true );
    }
}